

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

bool checkCanImportFromRootPaths(Options *options,QString *absolutePath,QString *moduleUrlPath)

{
  pointer pQVar1;
  long lVar2;
  bool bVar3;
  char cVar4;
  pointer pQVar5;
  long in_FS_OFFSET;
  QStringView QVar6;
  QStringView QVar7;
  QStringBuilder<QString_&,_const_QString_&> local_80;
  QString local_70;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (options->rootPaths).super__Vector_base<QString,_std::allocator<QString>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pQVar5 = (options->rootPaths).super__Vector_base<QString,_std::allocator<QString>_>._M_impl.
                super__Vector_impl_data._M_start; bVar3 = pQVar5 != pQVar1, bVar3;
      pQVar5 = pQVar5 + 1) {
    local_58.d.d = (pQVar5->d).d;
    local_58.d.ptr = (pQVar5->d).ptr;
    local_58.d.size = (pQVar5->d).size;
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_58.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_58.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_80.a = &local_58;
    local_80.b = moduleUrlPath;
    QStringBuilder<QString_&,_const_QString_&>::convertTo<QString>(&local_70,&local_80);
    lVar2 = (absolutePath->d).size;
    if (local_70.d.size == lVar2) {
      QVar6.m_data = local_70.d.ptr;
      QVar6.m_size = local_70.d.size;
      QVar7.m_data = (absolutePath->d).ptr;
      QVar7.m_size = lVar2;
      cVar4 = QtPrivate::equalStrings(QVar6,QVar7);
    }
    else {
      cVar4 = '\0';
    }
    if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (cVar4 != '\0') break;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool checkCanImportFromRootPaths(const Options *options, const QString &absolutePath,
                                 const QString &moduleUrlPath)
{
    for (auto rootPath : options->rootPaths) {
        if ((rootPath + moduleUrlPath) == absolutePath)
            return true;
    }
    return false;
}